

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
* ear::extraPosVerticalNominal
            (pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             *__return_storage_ptr__,Layout *layout)

{
  storage_type *this;
  double dVar1;
  pointer pCVar2;
  pointer pcVar3;
  value_type *pvVar4;
  bool bVar5;
  PolarPosition polarPosition;
  undefined8 uVar6;
  undefined8 uVar7;
  pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *ppVar8;
  Index size;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar9;
  long lVar10;
  string *psVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  char *pcVar13;
  double *pdVar14;
  Channel *channel;
  pointer pCVar15;
  value_type *__x;
  double dVar16;
  undefined1 auVar17 [16];
  VectorXd downmixRow;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  MatrixXd downmix;
  vector<ear::Channel,_std::allocator<ear::Channel>_> extraChannels;
  Layout currentLayerLayout;
  Layout midLayerLayout;
  double local_3f8;
  double local_3e8;
  string local_3d8;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [2];
  double local_388;
  bool local_380;
  dummy_u local_378;
  bool local_360;
  dummy_u local_358;
  bool local_348;
  dummy_u local_340;
  bool local_330;
  Matrix<double,__1,__1,_0,__1,__1> local_328;
  double local_310;
  string local_308;
  optional<ear::PolarPosition> local_2e8;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_2c8;
  pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *local_2a8;
  long local_2a0;
  optional<std::pair<double,_double>_> local_298;
  optional<std::pair<double,_double>_> local_280;
  double local_268 [6];
  string local_238;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_218;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_1f8;
  undefined8 local_1d8;
  double dStack_1d0;
  double local_1c8;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_1c0;
  undefined8 local_188;
  double local_180;
  Layout local_170;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_100;
  type local_c8;
  Layout local_b0;
  
  local_2c8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar9 = Layout::channels(layout);
  pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar9 = Layout::channels(layout);
  local_3b8._0_8_ = ((long)pCVar2 - (long)pCVar15 >> 4) * -0x71c71c71c71c71c7;
  local_3b8._8_8_ =
       ((long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
              super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
  if ((long)(local_3b8._8_8_ | local_3b8._0_8_) < 0) {
    pcVar13 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_00146160:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,pcVar13);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_328,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_3b8);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  local_1f8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultScreen();
  this = &local_100.super_type.m_storage;
  local_100.super_type.m_initialized = false;
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
            ((variant<ear::PolarScreen,_ear::CartesianScreen> *)this,
             (variant<ear::PolarScreen,_ear::CartesianScreen> *)local_3b8);
  local_100.super_type.m_initialized = true;
  Layout::Layout(&local_b0,&local_238,&local_1f8,&local_100);
  if (local_100.super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)this);
    local_100.super_type.m_initialized = false;
  }
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
            ((variant<ear::PolarScreen,_ear::CartesianScreen> *)local_3b8);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pvVar9 = Layout::channels(layout);
  pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar9 = Layout::channels(layout);
  pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar9 = Layout::channels(&local_b0);
  local_2a8 = __return_storage_ptr__;
  if (pCVar15 != pCVar2) {
    do {
      pcVar3 = (pCVar15->_name)._M_dataplus._M_p;
      local_3b8._0_8_ = local_3a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3b8,pcVar3,pcVar3 + (pCVar15->_name)._M_string_length);
      local_388 = (pCVar15->_polarPosition).distance;
      local_3a8[1]._0_8_ = (pCVar15->_polarPosition).azimuth;
      local_3a8[1]._8_8_ = (pCVar15->_polarPosition).elevation;
      local_380 = (pCVar15->_polarPositionNominal).super_type.m_initialized == true;
      if (local_380) {
        local_378._16_8_ =
             *(undefined8 *)
              ((long)&(pCVar15->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10);
        local_378.aligner_ = (pCVar15->_polarPositionNominal).super_type.m_storage.dummy_.aligner_;
        local_378._8_8_ =
             *(undefined8 *)
              ((long)&(pCVar15->_polarPositionNominal).super_type.m_storage.dummy_ + 8);
      }
      local_360 = (pCVar15->_azimuthRange).super_type.m_initialized == true;
      if (local_360) {
        local_358.aligner_ = (pCVar15->_azimuthRange).super_type.m_storage.dummy_.aligner_;
        local_358._8_8_ =
             *(undefined8 *)((long)&(pCVar15->_azimuthRange).super_type.m_storage.dummy_ + 8);
      }
      local_348 = (pCVar15->_elevationRange).super_type.m_initialized == true;
      if (local_348) {
        local_340.aligner_ = (pCVar15->_elevationRange).super_type.m_storage.dummy_.aligner_;
        local_340._8_8_ =
             *(undefined8 *)((long)&(pCVar15->_elevationRange).super_type.m_storage.dummy_ + 8);
      }
      local_330 = pCVar15->_isLfe;
      Channel::polarPositionNominal((Channel *)local_3b8);
      if (-10.0 <= (double)local_170._name._M_string_length) {
        Channel::polarPositionNominal((Channel *)local_3b8);
        bVar5 = local_268[1] <= 10.0;
      }
      else {
        bVar5 = false;
      }
      if (local_348 == true) {
        local_348 = false;
      }
      if (local_360 == true) {
        local_360 = false;
      }
      if (local_380 == true) {
        local_380 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._0_8_ != local_3a8) {
        operator_delete((void *)local_3b8._0_8_,local_3a8[0]._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back(pvVar9,pCVar15);
      }
      pCVar15 = pCVar15 + 1;
    } while (pCVar15 != pCVar2);
  }
  local_268[0] = -10.0;
  local_268[1] = -70.0;
  local_268[2] = -30.0;
  local_268[3] = 70.0;
  local_268[4] = 10.0;
  local_268[5] = 30.0;
  lVar10 = 0;
  do {
    local_310 = *(double *)((long)local_268 + lVar10 + 0x10);
    dVar16 = *(double *)((long)local_268 + lVar10);
    dVar1 = *(double *)((long)local_268 + lVar10 + 8);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    local_2a0 = lVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
    local_218.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getDefaultScreen();
    local_1c0.super_type.m_initialized = false;
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)&local_1c0.super_type.m_storage,
               (variant<ear::PolarScreen,_ear::CartesianScreen> *)local_3b8);
    local_1c0.super_type.m_initialized = true;
    Layout::Layout(&local_170,&local_308,&local_218,&local_1c0);
    if (local_1c0.super_type.m_initialized == true) {
      boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
                ((variant<ear::PolarScreen,_ear::CartesianScreen> *)&local_1c0.super_type.m_storage)
      ;
      local_1c0.super_type.m_initialized = false;
    }
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)local_3b8);
    std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    pvVar9 = Layout::channels(layout);
    __x = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
          super__Vector_impl_data._M_start;
    pvVar9 = Layout::channels(layout);
    pvVar4 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pvVar9 = Layout::channels(&local_170);
    for (; __x != pvVar4; __x = __x + 1) {
      pcVar3 = (__x->_name)._M_dataplus._M_p;
      local_3b8._0_8_ = local_3a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3b8,pcVar3,pcVar3 + (__x->_name)._M_string_length);
      local_388 = (__x->_polarPosition).distance;
      local_3a8[1]._0_8_ = (__x->_polarPosition).azimuth;
      local_3a8[1]._8_8_ = (__x->_polarPosition).elevation;
      local_380 = (__x->_polarPositionNominal).super_type.m_initialized == true;
      if (local_380) {
        local_378._16_8_ =
             *(undefined8 *)((long)&(__x->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10)
        ;
        local_378.aligner_ = (__x->_polarPositionNominal).super_type.m_storage.dummy_.aligner_;
        local_378._8_8_ =
             *(undefined8 *)((long)&(__x->_polarPositionNominal).super_type.m_storage.dummy_ + 8);
      }
      local_360 = (__x->_azimuthRange).super_type.m_initialized == true;
      if (local_360) {
        local_358.aligner_ = (__x->_azimuthRange).super_type.m_storage.dummy_.aligner_;
        local_358._8_8_ =
             *(undefined8 *)((long)&(__x->_azimuthRange).super_type.m_storage.dummy_ + 8);
      }
      local_348 = (__x->_elevationRange).super_type.m_initialized == true;
      if (local_348) {
        local_340.aligner_ = (__x->_elevationRange).super_type.m_storage.dummy_.aligner_;
        local_340._8_8_ =
             *(undefined8 *)((long)&(__x->_elevationRange).super_type.m_storage.dummy_ + 8);
      }
      local_330 = __x->_isLfe;
      Channel::polarPositionNominal((Channel *)local_3b8);
      if (dVar1 <= (double)local_3d8._M_string_length) {
        Channel::polarPositionNominal((Channel *)local_3b8);
        bVar5 = local_180 <= dVar16;
      }
      else {
        bVar5 = false;
      }
      if (local_348 == true) {
        local_348 = false;
      }
      if (local_360 == true) {
        local_360 = false;
      }
      if (local_380 == true) {
        local_380 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._0_8_ != local_3a8) {
        operator_delete((void *)local_3b8._0_8_,local_3a8[0]._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back(pvVar9,__x);
      }
    }
    pvVar9 = Layout::channels(&local_170);
    local_3f8 = local_310;
    local_3e8 = -1e-05;
    if ((pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      pvVar9 = Layout::channels(&local_170);
      pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_3e8 = 39.99999;
      if (pCVar15 != pCVar2) {
        local_3e8 = 2.2250738585072014e-308;
        do {
          Channel::polarPositionNominal(pCVar15);
          if (local_3e8 < ABS((double)local_3b8._0_8_)) {
            Channel::polarPositionNominal(pCVar15);
            local_3e8 = ABS((double)local_3b8._0_8_);
          }
          pCVar15 = pCVar15 + 1;
        } while (pCVar15 != pCVar2);
        local_3e8 = local_3e8 + 40.0 + -1e-05;
      }
      pvVar9 = Layout::channels(&local_170);
      pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pvVar9 = Layout::channels(&local_170);
      pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar15 == pCVar2) {
        local_3f8 = 0.0;
      }
      else {
        local_3f8 = 0.0;
        do {
          Channel::polarPosition(pCVar15);
          local_3f8 = local_3f8 + (double)local_3b8._8_8_;
          pCVar15 = pCVar15 + 1;
        } while (pCVar15 != pCVar2);
      }
      pvVar9 = Layout::channels(&local_170);
      lVar10 = ((long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
      auVar17._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar17._0_8_ = lVar10;
      auVar17._12_4_ = 0x45300000;
      local_3f8 = local_3f8 /
                  ((auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
    }
    pvVar9 = Layout::channels(&local_b0);
    pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl
                   .super__Vector_impl_data._M_start; pCVar15 != pCVar2; pCVar15 = pCVar15 + 1) {
      Channel::polarPosition(pCVar15);
      if (local_3e8 <= ABS((double)local_3b8._0_8_)) {
        local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"extra","");
        Channel::polarPosition(pCVar15);
        local_1d8 = local_188;
        dStack_1d0 = local_3f8;
        local_1c8 = 1.0;
        Channel::polarPositionNominal(pCVar15);
        local_2e8.super_type.m_storage.dummy_.aligner_ = local_c8;
        local_2e8.super_type.m_storage.dummy_._8_8_ = local_310;
        local_2e8.super_type.m_storage.dummy_._16_8_ = 0x3ff0000000000000;
        local_2e8.super_type.m_initialized = true;
        local_280.super_type.m_initialized = false;
        local_298.super_type.m_initialized = false;
        polarPosition.elevation = dStack_1d0;
        polarPosition.azimuth = (double)local_1d8;
        polarPosition.distance = local_1c8;
        Channel::Channel((Channel *)local_3b8,&local_3d8,polarPosition,&local_2e8,&local_280,
                         &local_298,false);
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::emplace_back<ear::Channel>
                  (&local_2c8,(Channel *)local_3b8);
        if (local_348 == true) {
          local_348 = false;
        }
        if (local_360 == true) {
          local_360 = false;
        }
        if (local_380 == true) {
          local_380 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._0_8_ != local_3a8) {
          operator_delete((void *)local_3b8._0_8_,local_3a8[0]._M_allocated_capacity + 1);
        }
        if (local_298.super_type.m_initialized == true) {
          local_298.super_type.m_initialized = false;
        }
        if (local_280.super_type.m_initialized == true) {
          local_280.super_type.m_initialized = false;
        }
        if (local_2e8.super_type.m_initialized == true) {
          local_2e8.super_type.m_initialized = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        pvVar9 = Layout::channels(layout);
        lVar10 = (long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                       _M_impl.super__Vector_impl_data._M_start;
        local_3b8._0_8_ = (lVar10 >> 4) * -0x71c71c71c71c71c7;
        local_3a8[0]._M_allocated_capacity = 0;
        if (lVar10 < -0x8f) {
          pcVar13 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_00146160;
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_3d8,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_3b8);
        Layout::channelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3b8,layout);
        uVar7 = local_3b8._8_8_;
        uVar6 = local_3b8._0_8_;
        psVar11 = Channel::name_abi_cxx11_(pCVar15);
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (uVar6,uVar7,psVar11);
        lVar10 = (long)(int)((ulong)((long)_Var12._M_current - uVar6) >> 5);
        if ((lVar10 < 0) || ((long)local_3d8._M_string_length <= lVar10)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        pcVar13 = local_3d8._M_dataplus._M_p + lVar10 * 8;
        pcVar13[0] = '\0';
        pcVar13[1] = '\0';
        pcVar13[2] = '\0';
        pcVar13[3] = '\0';
        pcVar13[4] = '\0';
        pcVar13[5] = '\0';
        pcVar13[6] = -0x10;
        pcVar13[7] = '?';
        Eigen::internal::
        conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
        ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_328,
              local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows + 1,
              local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
        if (local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0 &&
            local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                       );
        }
        if (local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows < 1) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        if (local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_3d8._M_string_length) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseBase.h"
                        ,0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
                       );
        }
        if (0 < local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_cols) {
          pdVar14 = local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data +
                    local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows + -1;
          dVar16 = 0.0;
          do {
            *pdVar14 = *(double *)(local_3d8._M_dataplus._M_p + (long)dVar16 * 8);
            dVar16 = (double)((long)dVar16 + 1);
            pdVar14 = pdVar14 + local_328.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
          } while ((double)local_328.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols != dVar16);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3b8);
        free(local_3d8._M_dataplus._M_p);
      }
    }
    if (local_170._screen.super_type.m_initialized == true) {
      boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
                ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
                 &local_170._screen.super_type.m_storage);
      local_170._screen.super_type.m_initialized = false;
    }
    std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_170._channels);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._name._M_dataplus._M_p != &local_170._name.field_2) {
      operator_delete(local_170._name._M_dataplus._M_p,
                      local_170._name.field_2._M_allocated_capacity + 1);
    }
    ppVar8 = local_2a8;
    lVar10 = local_2a0 + 0x18;
    if (lVar10 == 0x30) {
      std::
      pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::
      pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_true>
                (local_2a8,&local_2c8,&local_328);
      if (local_b0._screen.super_type.m_initialized == true) {
        boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
                  ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
                   &local_b0._screen.super_type.m_storage);
        local_b0._screen.super_type.m_initialized = false;
      }
      std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_b0._channels);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._name._M_dataplus._M_p != &local_b0._name.field_2) {
        operator_delete(local_b0._name._M_dataplus._M_p,
                        local_b0._name.field_2._M_allocated_capacity + 1);
      }
      free(local_328.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_2c8);
      return ppVar8;
    }
  } while( true );
}

Assistant:

std::pair<std::vector<Channel>, Eigen::MatrixXd> extraPosVerticalNominal(
      Layout layout) {
    std::vector<Channel> extraChannels;
    Eigen::MatrixXd downmix = Eigen::MatrixXd::Identity(
        layout.channels().size(), layout.channels().size());

    Layout midLayerLayout;
    std::copy_if(layout.channels().begin(), layout.channels().end(),
                 std::back_inserter(midLayerLayout.channels()), [](Channel c) {
                   return -10 <= c.polarPositionNominal().elevation &&
                          c.polarPositionNominal().elevation <= 10;
                 });

    auto layers = {std::make_tuple(-30.0, -70.0, -10.0),
                   std::make_tuple(30.0, 10.0, 70.0)};

    double layerNominalElevation, layerLowerBound, layerUpperBound;
    for (const auto& layer : layers) {
      std::tie(layerNominalElevation, layerLowerBound, layerUpperBound) = layer;

      Layout currentLayerLayout;
      std::copy_if(
          layout.channels().begin(), layout.channels().end(),
          std::back_inserter(currentLayerLayout.channels()), [&](Channel c) {
            return layerLowerBound <= c.polarPositionNominal().elevation &&
                   c.polarPositionNominal().elevation <= layerUpperBound;
          });

      // for each loudspeaker in the mid layer that has an azimuth greater
      // than az_limit, add a virtual speaker directly above/below it at the
      // elevation of the current layer, which is downmixed directly to the
      // mid layer loudspeaker. az_limit is set to the range of azimuths in
      // the current layer, with some space added to prevent fast vertical
      // source movements when sources move horizontally. If there are no
      // channels on this layer then a copy of all mid layer speakers is
      // made.
      double azimuthLimit = 0.0;
      double layerRealElevation = 0.0;
      if (currentLayerLayout.channels().size() != 0) {
        double azimuthRange = std::numeric_limits<double>::min();
        for (const auto& channel : currentLayerLayout.channels()) {
          if (azimuthRange < std::abs(channel.polarPositionNominal().azimuth)) {
            azimuthRange = std::abs(channel.polarPositionNominal().azimuth);
          }
        }
        azimuthLimit = azimuthRange + 40.0;
        layerRealElevation =
            std::accumulate(currentLayerLayout.channels().begin(),
                            currentLayerLayout.channels().end(), 0.0,
                            [&](double sum, const Channel& c) -> double {
                              return sum + c.polarPosition().elevation;
                            }) /
            static_cast<double>(currentLayerLayout.channels().size());
      } else {
        layerRealElevation = layerNominalElevation;
      }

      double epsilon = 1e-5;
      for (const auto& midChannel : midLayerLayout.channels()) {
        if (std::abs(midChannel.polarPosition().azimuth) >=
            azimuthLimit - epsilon) {
          extraChannels.push_back(Channel(
              "extra",
              PolarPosition(midChannel.polarPosition().azimuth,
                            layerRealElevation, 1.0),
              PolarPosition(midChannel.polarPositionNominal().azimuth,
                            layerNominalElevation, 1.0)

                  ));
          Eigen::VectorXd downmixRow =
              Eigen::VectorXd::Zero(layout.channels().size());
          auto names = layout.channelNames();
          int midChannelIndex = static_cast<int>(std::distance(
              names.begin(),
              std::find(names.begin(), names.end(), midChannel.name())));
          downmixRow(midChannelIndex) = 1.0;
          downmix.conservativeResize(downmix.rows() + 1, Eigen::NoChange);
          downmix.row(downmix.rows() - 1) = downmixRow;
        }
      }
    }
    return std::make_pair(extraChannels, downmix);
  }